

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O1

int Curl_blockread_all(connectdata *conn,curl_socket_t sockfd,char *buf,ssize_t buffersize,
                      ssize_t *n)

{
  bool bVar1;
  int iVar2;
  CURLcode CVar3;
  timediff_t timeout_ms;
  size_t sVar4;
  long lVar5;
  ssize_t nread;
  long local_38;
  
  *n = 0;
  lVar5 = 0;
  do {
    timeout_ms = Curl_timeleft(conn->data,(curltime *)0x0,true);
    bVar1 = true;
    if (timeout_ms < 0) {
      CVar3 = CURLE_OPERATION_TIMEDOUT;
    }
    else {
      iVar2 = Curl_socket_check(sockfd,-1,-1,timeout_ms);
      if (iVar2 < 1) {
LAB_0045e743:
        CVar3 = ~CURLE_OK;
      }
      else {
        CVar3 = Curl_read_plain(sockfd,buf,buffersize,&local_38);
        if (CVar3 == CURLE_OK) {
          sVar4 = buffersize - local_38;
          if (sVar4 != 0) {
            if (local_38 == 0) goto LAB_0045e743;
            buf = buf + local_38;
            lVar5 = lVar5 + local_38;
            CVar3 = CURLE_OK;
            goto LAB_0045e73e;
          }
          lVar5 = lVar5 + local_38;
          *n = lVar5;
          CVar3 = CURLE_OK;
        }
        else {
          sVar4 = buffersize;
          if (CVar3 == CURLE_AGAIN) {
LAB_0045e73e:
            bVar1 = false;
            buffersize = sVar4;
          }
        }
      }
    }
    if (bVar1) {
      return CVar3;
    }
  } while( true );
}

Assistant:

int Curl_blockread_all(struct connectdata *conn, /* connection data */
                       curl_socket_t sockfd,     /* read from this socket */
                       char *buf,                /* store read data here */
                       ssize_t buffersize,       /* max amount to read */
                       ssize_t *n)               /* amount bytes read */
{
  ssize_t nread;
  ssize_t allread = 0;
  int result;
  *n = 0;
  for(;;) {
    timediff_t timeleft = Curl_timeleft(conn->data, NULL, TRUE);
    if(timeleft < 0) {
      /* we already got the timeout */
      result = CURLE_OPERATION_TIMEDOUT;
      break;
    }
    if(SOCKET_READABLE(sockfd, timeleft) <= 0) {
      result = ~CURLE_OK;
      break;
    }
    result = Curl_read_plain(sockfd, buf, buffersize, &nread);
    if(CURLE_AGAIN == result)
      continue;
    if(result)
      break;

    if(buffersize == nread) {
      allread += nread;
      *n = allread;
      result = CURLE_OK;
      break;
    }
    if(!nread) {
      result = ~CURLE_OK;
      break;
    }

    buffersize -= nread;
    buf += nread;
    allread += nread;
  }
  return result;
}